

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::OpenPopupEx(ImGuiID id)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  bool bVar4;
  uint *puVar5;
  ImGuiPopupData *pIVar6;
  ImVec2 *local_68;
  undefined1 local_58 [8];
  ImGuiPopupData popup_ref;
  int current_stack_size;
  ImGuiWindow *parent_window;
  ImGuiContext *g;
  ImGuiID id_local;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  popup_ref.OpenMousePos.y = (float)(GImGui->BeginPopupStack).Size;
  ImGuiPopupData::ImGuiPopupData((ImGuiPopupData *)local_58);
  popup_ref.PopupId = 0;
  popup_ref._4_4_ = 0;
  popup_ref.Window = pIVar2->NavWindow;
  popup_ref.SourceWindow._0_4_ = pIVar2->FrameCount;
  local_58._0_4_ = id;
  puVar5 = ImVector<unsigned_int>::back(&pIVar1->IDStack);
  popup_ref.SourceWindow._4_4_ = *puVar5;
  popup_ref._24_8_ = NavCalcPreferredRefPos();
  bVar4 = IsMousePosValid(&(pIVar2->IO).MousePos);
  if (bVar4) {
    local_68 = &(pIVar2->IO).MousePos;
  }
  else {
    local_68 = (ImVec2 *)&popup_ref.OpenFrameCount;
  }
  popup_ref.OpenPopupPos = *local_68;
  if ((pIVar2->OpenPopupStack).Size < (int)popup_ref.OpenMousePos.y + 1) {
    ImVector<ImGuiPopupData>::push_back(&pIVar2->OpenPopupStack,(ImGuiPopupData *)local_58);
  }
  else {
    pIVar6 = ImVector<ImGuiPopupData>::operator[]
                       (&pIVar2->OpenPopupStack,(int)popup_ref.OpenMousePos.y);
    if ((pIVar6->PopupId == id) &&
       (pIVar6 = ImVector<ImGuiPopupData>::operator[]
                           (&pIVar2->OpenPopupStack,(int)popup_ref.OpenMousePos.y),
       iVar3 = (int)popup_ref.SourceWindow, pIVar6->OpenFrameCount == pIVar2->FrameCount + -1)) {
      pIVar6 = ImVector<ImGuiPopupData>::operator[]
                         (&pIVar2->OpenPopupStack,(int)popup_ref.OpenMousePos.y);
      pIVar6->OpenFrameCount = iVar3;
    }
    else {
      ImVector<ImGuiPopupData>::resize(&pIVar2->OpenPopupStack,(int)popup_ref.OpenMousePos.y + 1);
      pIVar6 = ImVector<ImGuiPopupData>::operator[]
                         (&pIVar2->OpenPopupStack,(int)popup_ref.OpenMousePos.y);
      memcpy(pIVar6,local_58,0x30);
    }
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    int current_stack_size = g.BeginPopupStack.Size;
    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.SourceWindow = g.NavWindow;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    //IMGUI_DEBUG_LOG("OpenPopupEx(0x%08X)\n", g.FrameCount, id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            g.OpenPopupStack.resize(current_stack_size + 1);
            g.OpenPopupStack[current_stack_size] = popup_ref;
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}